

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1SelfguidedFilterTest_CorrectnessTest_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AV1SelfguidedFilterTest_CorrectnessTest_Test>
           *this)

{
  AV1SelfguidedFilterTest *this_00;
  
  WithParamInterface<std::tuple<int(*)(unsigned_char_const*,int,int,int,int,int_const*,unsigned_char*,int,int*,int,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (AV1SelfguidedFilterTest *)operator_new(0x20);
  anon_unknown.dwarf_4045ec::AV1SelfguidedFilterTest::AV1SelfguidedFilterTest(this_00);
  (this_00->
  super_TestWithParam<std::tuple<int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int)>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00ef0188;
  (this_00->
  super_TestWithParam<std::tuple<int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int)>_>
  ).
  super_WithParamInterface<std::tuple<int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int)>_>
  ._vptr_WithParamInterface = (_func_int **)&DAT_00ef01c8;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }